

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

void __thiscall capnp::compiler::Expression::Builder::setBinary(Builder *this,Reader value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)(this->_builder).data = 8;
  local_18.pointer = (this->_builder).pointers;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::setBlob<capnp::Data>(&local_18,value);
  return;
}

Assistant:

inline void Expression::Builder::setBinary( ::capnp::Data::Reader value) {
  _builder.setDataField<Expression::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Expression::BINARY);
  ::capnp::_::PointerHelpers< ::capnp::Data>::set(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), value);
}